

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O1

void __thiscall QProcessPrivate::commitChannels(QProcessPrivate *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar2 = (this->stdinChannel).pipe[0];
  if (iVar2 != -1) {
    do {
      iVar1 = dup3(iVar2,0,0);
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  iVar2 = (this->stdoutChannel).pipe[1];
  if (iVar2 != -1) {
    do {
      iVar1 = dup3(iVar2,1,0);
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  iVar2 = (this->stderrChannel).pipe[1];
  if (iVar2 == -1) {
    if (this->processChannelMode == '\x01') {
      do {
        iVar2 = dup3(1,2,0);
        if (iVar2 != -1) {
          return;
        }
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
    }
  }
  else {
    do {
      iVar1 = dup3(iVar2,2,0);
      if (iVar1 != -1) {
        return;
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  return;
}

Assistant:

void QProcessPrivate::commitChannels() const
{
    // copy the stdin socket if asked to (without closing on exec)
    if (stdinChannel.pipe[0] != INVALID_Q_PIPE)
        qt_safe_dup2(stdinChannel.pipe[0], STDIN_FILENO, 0);

    // copy the stdout and stderr if asked to
    if (stdoutChannel.pipe[1] != INVALID_Q_PIPE)
        qt_safe_dup2(stdoutChannel.pipe[1], STDOUT_FILENO, 0);
    if (stderrChannel.pipe[1] != INVALID_Q_PIPE) {
        qt_safe_dup2(stderrChannel.pipe[1], STDERR_FILENO, 0);
    } else {
        // merge stdout and stderr if asked to
        if (processChannelMode == QProcess::MergedChannels)
            qt_safe_dup2(STDOUT_FILENO, STDERR_FILENO, 0);
    }
}